

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O0

handle * __thiscall
gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::try_lock
          (handle *__return_storage_ptr__,shared_guarded_opt<int,_std::shared_timed_mutex> *this)

{
  shared_timed_mutex *in_RCX;
  unique_lock<std::shared_timed_mutex> local_28;
  shared_guarded_opt<int,_std::shared_timed_mutex> *local_18;
  shared_guarded_opt<int,_std::shared_timed_mutex> *this_local;
  
  local_18 = this;
  this_local = (shared_guarded_opt<int,_std::shared_timed_mutex> *)__return_storage_ptr__;
  if ((this->enabled & 1U) == 0) {
    std::unique_lock<std::shared_timed_mutex>::unique_lock(&local_28);
    lock_handle<int,_std::shared_timed_mutex>::lock_handle
              (__return_storage_ptr__,&this->m_obj,&local_28);
    std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_28);
  }
  else {
    try_lock_handle<int,std::shared_timed_mutex>
              (__return_storage_ptr__,(libguarded *)this,(int *)&this->m_mutex,in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

auto shared_guarded_opt<T, M>::try_lock() -> handle
{
    return (enabled) ? try_lock_handle(&m_obj, m_mutex) :
                       handle(&m_obj, std::unique_lock<M>{});
}